

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

MeasurementSystem __thiscall QLocale::measurementSystem(QLocale *this)

{
  bool bVar1;
  MeasurementSystem MVar2;
  QSystemLocale *pQVar3;
  QLocalePrivate *this_00;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d).d.ptr;
  if (this_00->m_data == &systemLocaleData) {
    local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_40 = 2;
    (*pQVar3->_vptr_QSystemLocale[2])(&local_38,pQVar3,0x19);
    ::QVariant::~QVariant((QVariant *)&local_58);
    bVar1 = ::QVariant::isNull((QVariant *)&local_38);
    if (!bVar1) {
      MVar2 = ::QVariant::toInt((QVariant *)&local_38,(bool *)0x0);
      ::QVariant::~QVariant((QVariant *)&local_38);
      goto LAB_0030f0fe;
    }
    ::QVariant::~QVariant((QVariant *)&local_38);
    this_00 = (this->d).d.ptr;
  }
  MVar2 = QLocalePrivate::measurementSystem(this_00);
LAB_0030f0fe:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return MVar2;
  }
  __stack_chk_fail();
}

Assistant:

QLocale::MeasurementSystem QLocale::measurementSystem() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        const auto res = systemLocale()->query(QSystemLocale::MeasurementSystem);
        if (!res.isNull())
            return MeasurementSystem(res.toInt());
    }
#endif

    return d->measurementSystem();
}